

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O2

int __thiscall brown::App::runLogic(App *this)

{
  _func_void_Simulator_ptr *p_Var1;
  
  p_Var1 = this->userInit;
  while( true ) {
    if (p_Var1 != (_func_void_Simulator_ptr *)0x0) {
      (*p_Var1)(this->sim);
    }
    if (this->isBreak != false) break;
    (**this->sim->_vptr_Simulator)();
    p_Var1 = this->userLoop;
  }
  return 0;
}

Assistant:

int App::runLogic() {
    if (userInit) {userInit(sim);}
    while (!isBreak) {
        sim.hardwareLoop();
        if (userLoop) {userLoop(sim);}
    }
    return 0;
}